

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O3

MPP_RET jpege_deinit_v2(void *ctx)

{
  long lVar1;
  
  lVar1 = *ctx;
  if (((byte)jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","enter ctx %p\n","jpege_deinit_v2",ctx);
  }
  if (*(void **)(lVar1 + 0x360) != (void *)0x0) {
    mpp_osal_free("jpege_deinit_v2",*(void **)(lVar1 + 0x360));
  }
  *(undefined8 *)(lVar1 + 0x360) = 0;
  if (*(void **)(lVar1 + 0x368) != (void *)0x0) {
    mpp_osal_free("jpege_deinit_v2",*(void **)(lVar1 + 0x368));
  }
  *(undefined8 *)(lVar1 + 0x368) = 0;
  if (*(void **)(lVar1 + 0x370) != (void *)0x0) {
    mpp_osal_free("jpege_deinit_v2",*(void **)(lVar1 + 0x370));
  }
  *(undefined8 *)(lVar1 + 0x370) = 0;
  if (((byte)jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","leave ctx %p\n","jpege_deinit_v2",ctx);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET jpege_deinit_v2(void *ctx)
{
    JpegeCtx *p = (JpegeCtx *)ctx;
    MppEncJpegCfg *jpeg_cfg = &p->cfg->codec.jpeg;

    jpege_dbg_func("enter ctx %p\n", ctx);

    MPP_FREE(jpeg_cfg->qtable_y);
    MPP_FREE(jpeg_cfg->qtable_u);
    MPP_FREE(jpeg_cfg->qtable_v);

    jpege_dbg_func("leave ctx %p\n", ctx);
    return MPP_OK;
}